

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 FindTag(SySet *pSet,char *zTag,int nByte)

{
  void *pvVar1;
  SyString *pSVar2;
  ushort **ppuVar3;
  undefined8 *puVar4;
  bool bVar5;
  int local_6c;
  uint local_60;
  sxu32 n;
  sxi32 rc;
  SyString *pEntry;
  SyString *aEntry;
  SyString sTag;
  char *zEnd;
  char *zCur;
  SyString *pSStack_20;
  int nByte_local;
  char *zTag_local;
  SySet *pSet_local;
  
  if (pSet->nUsed != 0) {
    pSVar2 = (SyString *)(zTag + nByte);
    pSStack_20 = (SyString *)zTag;
    while( true ) {
      aEntry = pSStack_20;
      bVar5 = false;
      if ((((pSStack_20 < pSVar2) && (bVar5 = true, *(char *)&pSStack_20->zString != '<')) &&
          (bVar5 = true, *(char *)&pSStack_20->zString != '/')) &&
         ((bVar5 = true, *(char *)&pSStack_20->zString != '?' &&
          (bVar5 = false, *(byte *)&pSStack_20->zString < 0xc0)))) {
        ppuVar3 = __ctype_b_loc();
        bVar5 = ((*ppuVar3)[(int)*(char *)&pSStack_20->zString] & 0x2000) != 0;
      }
      if (!bVar5) break;
      pSStack_20 = (SyString *)((long)&pSStack_20->zString + 1);
    }
    while (pSStack_20 < pSVar2) {
      if (*(byte *)&pSStack_20->zString < 0xc0) {
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)*(char *)&pSStack_20->zString] & 8) == 0) break;
        pSStack_20 = (SyString *)((long)&pSStack_20->zString + 1);
      }
      else {
        do {
          pSStack_20 = (SyString *)((long)&pSStack_20->zString + 1);
          bVar5 = false;
          if (pSStack_20 < pSVar2) {
            bVar5 = ((ulong)pSStack_20->zString & 0xc0) == 0x80;
          }
        } while (bVar5);
      }
    }
    sTag.zString._0_4_ = (int)pSStack_20 - (int)aEntry;
    while( true ) {
      bVar5 = false;
      if ((((sxu32)sTag.zString != 0) && (bVar5 = false, *(byte *)&aEntry->zString < 0xc0)) &&
         (bVar5 = true, *(char *)&aEntry->zString != '\0')) {
        ppuVar3 = __ctype_b_loc();
        bVar5 = ((*ppuVar3)[(int)*(char *)&aEntry->zString] & 0x2000) != 0;
      }
      if (!bVar5) break;
      sTag.zString._0_4_ = (sxu32)sTag.zString - 1;
      aEntry = (SyString *)((long)&aEntry->zString + 1);
    }
    if ((sxu32)sTag.zString != 0) {
      pvVar1 = pSet->pBase;
      for (local_60 = 0; local_60 < pSet->nUsed; local_60 = local_60 + 1) {
        puVar4 = (undefined8 *)((long)pvVar1 + (ulong)local_60 * 0x10);
        if (*(sxu32 *)(puVar4 + 1) == (sxu32)sTag.zString) {
          local_6c = SyStrnicmp((char *)*puVar4,(char *)aEntry,(sxu32)sTag.zString);
        }
        else {
          local_6c = *(int *)(puVar4 + 1) - (sxu32)sTag.zString;
        }
        if (local_6c == 0) {
          return 0;
        }
      }
    }
  }
  return -6;
}

Assistant:

static sxi32 FindTag(SySet *pSet, const char *zTag, int nByte)
{
	if( SySetUsed(pSet) > 0 ){
		const char *zCur, *zEnd = &zTag[nByte];
		SyString sTag;
		while( zTag < zEnd &&  (zTag[0] == '<' || zTag[0] == '/' || zTag[0] == '?' ||
			((unsigned char)zTag[0] < 0xc0 && SyisSpace(zTag[0]))) ){
			zTag++;
		}
		/* Delimit the tag */
		zCur = zTag;
		while(zTag < zEnd ){
			if( (unsigned char)zTag[0] >= 0xc0 ){
				/* UTF-8 stream */
				zTag++;
				SX_JMP_UTF8(zTag, zEnd);
			}else if( !SyisAlphaNum(zTag[0]) ){
				break;
			}else{
				zTag++;
			}
		}
		SyStringInitFromBuf(&sTag, zCur, zTag-zCur);
		/* Trim leading white spaces and null bytes */
		SyStringLeftTrimSafe(&sTag);
		if( sTag.nByte > 0 ){
			SyString *aEntry, *pEntry;
			sxi32 rc;
			sxu32 n;
			/* Perform the lookup */
			aEntry = (SyString *)SySetBasePtr(pSet);
			for( n = 0 ; n < SySetUsed(pSet) ; ++n ){
				pEntry = &aEntry[n];
				/* Do the comparison */
				rc = SyStringCmp(pEntry, &sTag, SyStrnicmp);
				if( !rc ){
					return SXRET_OK;
				}
			}
		}
	}
	/* No such tag */
	return SXERR_NOTFOUND;
}